

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parseIfExpr(Parser *this)

{
  line_t *plVar1;
  unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> *puVar2;
  pointer pcVar3;
  long *plVar4;
  undefined1 auVar5 [8];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 *puVar9;
  long *plVar10;
  Parser *in_RSI;
  pointer __old_p;
  long *plVar11;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> condition;
  unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> thenBlock;
  Token keyword;
  undefined1 local_c8 [8];
  _Alloc_hider _Stack_c0;
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_a8;
  undefined1 local_98 [16];
  undefined1 local_88 [40];
  unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> *local_60;
  size_type local_58;
  unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> local_50;
  TokenType TStack_48;
  undefined4 uStack_44;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_88._32_4_ = (in_RSI->m_previous).type;
  local_60 = &local_50;
  pcVar3 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar3,pcVar3 + (in_RSI->m_previous).lexeme._M_string_length);
  local_40._M_allocated_capacity._4_2_ = (in_RSI->m_previous).col;
  local_40._M_allocated_capacity._0_4_ = (in_RSI->m_previous).line;
  parseExpr((Parser *)local_98);
  local_c8 = (undefined1  [8])local_b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c8,"Expected \'{\' or \'=>\' before if expression body.","");
  expectBlock((Parser *)(local_98 + 8),(string *)in_RSI);
  if (local_c8 != (undefined1  [8])local_b8) {
    operator_delete((void *)local_c8,(ulong)(local_b8._0_8_ + 1));
  }
  local_88._0_8_ = 0;
  local_88._8_8_ = (pointer)0x0;
  local_88._16_8_ = 0;
  local_40._8_8_ = this;
  puVar9 = (undefined8 *)operator_new(0x38);
  local_c8._0_4_ = (in_RSI->m_previous).type;
  puVar2 = (unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> *)(local_b8 + 8);
  pcVar3 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
  _Stack_c0._M_p = (pointer)puVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&_Stack_c0,pcVar3,pcVar3 + (in_RSI->m_previous).lexeme._M_string_length);
  plVar1 = &(in_RSI->m_previous).line;
  aStack_a8._12_2_ = (in_RSI->m_previous).col;
  aStack_a8._8_4_ = *plVar1;
  *puVar9 = &PTR__UnitExpr_00128f88;
  *(undefined4 *)(puVar9 + 1) = local_c8._0_4_;
  puVar9[2] = puVar9 + 4;
  if ((unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> *)_Stack_c0._M_p == puVar2) {
    puVar9[4] = local_b8._8_8_;
    puVar9[5] = CONCAT44(aStack_a8._4_4_,aStack_a8._0_4_);
  }
  else {
    puVar9[2] = _Stack_c0._M_p;
    puVar9[4] = local_b8._8_8_;
  }
  puVar9[3] = local_b8._0_8_;
  local_b8._0_8_ = (pointer)0x0;
  local_b8._8_8_ = local_b8._8_8_ & 0xffffffffffffff00;
  *(col_t *)((long)puVar9 + 0x34) = (in_RSI->m_previous).col;
  *(line_t *)(puVar9 + 6) = *plVar1;
  _Stack_c0._M_p = (pointer)puVar2;
  plVar10 = (long *)operator_new(0x28);
  uVar8 = local_88._16_8_;
  uVar7 = local_88._8_8_;
  uVar6 = local_88._0_8_;
  local_88._0_8_ = (long *)0x0;
  local_88._8_8_ = (pointer)0x0;
  local_88._16_8_ = 0;
  *plVar10 = (long)&PTR__BlockExpr_00128fe0;
  plVar10[1] = uVar6;
  plVar10[2] = uVar7;
  plVar10[3] = uVar8;
  local_b8._0_8_ = (pointer)0x0;
  local_c8 = (undefined1  [8])0x0;
  _Stack_c0._M_p = (pointer)0x0;
  plVar10[4] = (long)puVar9;
  std::
  vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  ::~vector((vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
             *)local_c8);
  std::
  vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  ::~vector((vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
             *)local_88);
  plVar11 = plVar10;
  if ((in_RSI->m_current).type == ELSE) {
    advance(in_RSI);
    if ((in_RSI->m_current).type == IF) {
      advance(in_RSI);
      parseIfExpr((Parser *)local_c8);
      auVar5 = local_c8;
      local_c8 = (undefined1  [8])0x0;
      plVar4 = (long *)plVar10[4];
      plVar10[4] = (long)auVar5;
      if (plVar4 != (long *)0x0) {
        (**(code **)(*plVar4 + 8))();
      }
    }
    else {
      local_c8 = (undefined1  [8])local_b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c8,"Expected \'{\' or \'=>\' after \'else\'.","");
      expectBlock((Parser *)local_88,(string *)in_RSI);
      plVar11 = (long *)local_88._0_8_;
      local_88._0_8_ = 0;
      (**(code **)(*plVar10 + 8))(plVar10);
      local_88._0_8_ = (long *)0x0;
      if (local_c8 != (undefined1  [8])local_b8) {
        operator_delete((void *)local_c8,(ulong)(local_b8._0_8_ + 1));
      }
    }
  }
  puVar9 = (undefined8 *)operator_new(0x50);
  if (local_60 == &local_50) {
    aStack_a8._0_4_ = TStack_48;
    aStack_a8._4_4_ = uStack_44;
    _Stack_c0._M_p = (pointer)puVar2;
  }
  else {
    _Stack_c0._M_p = (pointer)local_60;
  }
  local_b8._12_2_ =
       local_50._M_t.super___uniq_ptr_impl<enact::Stmt,_std::default_delete<enact::Stmt>_>._M_t.
       super__Tuple_impl<0UL,_enact::Stmt_*,_std::default_delete<enact::Stmt>_>.
       super__Head_base<0UL,_enact::Stmt_*,_false>._M_head_impl._4_2_;
  local_b8._14_2_ =
       local_50._M_t.super___uniq_ptr_impl<enact::Stmt,_std::default_delete<enact::Stmt>_>._M_t.
       super__Tuple_impl<0UL,_enact::Stmt_*,_std::default_delete<enact::Stmt>_>.
       super__Head_base<0UL,_enact::Stmt_*,_false>._M_head_impl._6_2_;
  local_b8._8_4_ =
       (line_t)local_50._M_t.super___uniq_ptr_impl<enact::Stmt,_std::default_delete<enact::Stmt>_>.
               _M_t.super__Tuple_impl<0UL,_enact::Stmt_*,_std::default_delete<enact::Stmt>_>.
               super__Head_base<0UL,_enact::Stmt_*,_false>._M_head_impl;
  *puVar9 = &PTR__IfExpr_00129308;
  puVar9[1] = local_98._0_8_;
  puVar9[2] = local_98._8_8_;
  puVar9[3] = plVar11;
  *(undefined4 *)(puVar9 + 4) = local_88._32_4_;
  puVar9[5] = puVar9 + 7;
  if ((unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> *)_Stack_c0._M_p == puVar2) {
    *(line_t *)(puVar9 + 7) =
         (line_t)local_50._M_t.super___uniq_ptr_impl<enact::Stmt,_std::default_delete<enact::Stmt>_>
                 ._M_t.super__Tuple_impl<0UL,_enact::Stmt_*,_std::default_delete<enact::Stmt>_>.
                 super__Head_base<0UL,_enact::Stmt_*,_false>._M_head_impl;
    *(undefined4 *)((long)puVar9 + 0x3c) =
         local_50._M_t.super___uniq_ptr_impl<enact::Stmt,_std::default_delete<enact::Stmt>_>._M_t.
         super__Tuple_impl<0UL,_enact::Stmt_*,_std::default_delete<enact::Stmt>_>.
         super__Head_base<0UL,_enact::Stmt_*,_false>._M_head_impl._4_4_;
    *(undefined4 *)(puVar9 + 8) = aStack_a8._0_4_;
    *(undefined4 *)((long)puVar9 + 0x44) = aStack_a8._4_4_;
  }
  else {
    puVar9[5] = _Stack_c0._M_p;
    puVar9[7] = local_b8._8_8_;
  }
  puVar9[6] = local_58;
  *(undefined2 *)((long)puVar9 + 0x4c) = local_40._M_allocated_capacity._4_2_;
  *(undefined4 *)(puVar9 + 9) = local_40._M_allocated_capacity._0_4_;
  *(undefined8 **)local_40._8_8_ = puVar9;
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (tuple<enact::Expr_*,_std::default_delete<enact::Expr>_>)local_40._8_8_;
}

Assistant:

std::unique_ptr<Expr> Parser::parseIfExpr() {
        Token keyword = m_previous;

        std::unique_ptr<Expr> condition = parseExpr();
        std::unique_ptr<BlockExpr> thenBlock = expectBlock("Expected '{' or '=>' before if expression body.");

        std::unique_ptr<BlockExpr> elseBlock = std::make_unique<BlockExpr>(
                std::vector<std::unique_ptr<Stmt>>{},
                std::make_unique<UnitExpr>(m_previous));

        if (consume(TokenType::ELSE)) {
            // Special case, so we can type 'else if' instead of 'else => if'
            if (consume(TokenType::IF)) {
                elseBlock->expr = parseIfExpr();
            } else {
                elseBlock = expectBlock("Expected '{' or '=>' after 'else'.");
            }
        }

        return std::make_unique<IfExpr>(
                std::move(condition),
                std::move(thenBlock),
                std::move(elseBlock),
                std::move(keyword));
    }